

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O0

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::advance_time
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1> *this,HalfCycles duration)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  IntType IVar4;
  HalfCycles HVar5;
  Cycles local_c0;
  WrappedInt<Cycles> local_b8;
  long local_b0;
  IntType ticks;
  HalfCycles local_a0;
  WrappedInt<HalfCycles> local_98;
  HalfCycles mouse_ticks;
  HalfCycles keyboard_ticks;
  HalfCycles local_60;
  WrappedInt<HalfCycles> local_58;
  WrappedInt<HalfCycles> local_50;
  WrappedInt<HalfCycles> local_48;
  HalfCycles via_cycles;
  HalfCycles via_cycles_outstanding;
  HalfCycles via_time_base;
  ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1> *this_local;
  HalfCycles duration_local;
  
  this_local = (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1> *)
               duration.super_WrappedInt<HalfCycles>.length_;
  WrappedInt<HalfCycles>::operator+=
            (&(this->time_since_video_update_).super_WrappedInt<HalfCycles>,
             (HalfCycles *)&this_local);
  JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::operator+=(&this->iwm_,(HalfCycles)this_local);
  iVar1 = this->ram_subcycle_;
  IVar4 = WrappedInt<HalfCycles>::as_integral((WrappedInt<HalfCycles> *)&this_local);
  this->ram_subcycle_ = iVar1 + (int)IVar4 & 0xf;
  bVar2 = WrappedInt<HalfCycles>::operator<
                    (&(this->time_since_video_update_).super_WrappedInt<HalfCycles>,
                     &this->time_until_video_event_);
  if (bVar2) {
    WrappedInt<HalfCycles>::operator+=
              (&(this->via_clock_).super_WrappedInt<HalfCycles>,(HalfCycles *)&this_local);
    HalfCycles::HalfCycles(&via_time_base,10);
    HVar5 = WrappedInt<HalfCycles>::divide<HalfCycles>
                      (&(this->via_clock_).super_WrappedInt<HalfCycles>,&via_time_base);
    MOS::MOS6522::
    MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
    ::run_for(&this->via_,HVar5);
  }
  else {
    via_cycles_outstanding =
         WrappedInt<HalfCycles>::operator-
                   (&(this->time_since_video_update_).super_WrappedInt<HalfCycles>,
                    (HalfCycles *)&this_local);
    via_cycles.super_WrappedInt<HalfCycles>.length_ =
         (WrappedInt<HalfCycles>)(WrappedInt<HalfCycles>)this_local;
    while (bVar2 = WrappedInt<HalfCycles>::operator<
                             (&(this->time_until_video_event_).super_WrappedInt<HalfCycles>,
                              &this->time_since_video_update_), bVar2) {
      local_48.length_ =
           (IntType)WrappedInt<HalfCycles>::operator-
                              (&(this->time_until_video_event_).super_WrappedInt<HalfCycles>,
                               &via_cycles_outstanding);
      HalfCycles::HalfCycles((HalfCycles *)&local_50,0);
      via_cycles_outstanding.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)(WrappedInt<HalfCycles>)local_50.length_;
      WrappedInt<HalfCycles>::operator-=
                (&via_cycles.super_WrappedInt<HalfCycles>,(HalfCycles *)&local_48);
      WrappedInt<HalfCycles>::operator+=
                (&(this->via_clock_).super_WrappedInt<HalfCycles>,(HalfCycles *)&local_48);
      HalfCycles::HalfCycles(&local_60,10);
      local_58.length_ =
           (IntType)WrappedInt<HalfCycles>::divide<HalfCycles>
                              (&(this->via_clock_).super_WrappedInt<HalfCycles>,&local_60);
      MOS::MOS6522::
      MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
      ::run_for(&this->via_,(HalfCycles)local_58.length_);
      Macintosh::Video::run_for
                (&this->video_,
                 (HalfCycles)(this->time_until_video_event_).super_WrappedInt<HalfCycles>.length_);
      WrappedInt<HalfCycles>::operator-=
                (&(this->time_since_video_update_).super_WrappedInt<HalfCycles>,
                 &this->time_until_video_event_);
      HVar5 = Macintosh::Video::next_sequence_point(&this->video_);
      (this->time_until_video_event_).super_WrappedInt<HalfCycles>.length_ =
           (IntType)HVar5.super_WrappedInt<HalfCycles>.length_;
      bVar2 = Macintosh::Video::vsync(&this->video_);
      MOS::MOS6522::
      MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
      ::set_control_line_input(&this->via_,A,One,(bool)((bVar2 ^ 0xffU) & 1));
    }
    WrappedInt<HalfCycles>::operator+=(&(this->via_clock_).super_WrappedInt<HalfCycles>,&via_cycles)
    ;
    HalfCycles::HalfCycles(&keyboard_ticks,10);
    HVar5 = WrappedInt<HalfCycles>::divide<HalfCycles>
                      (&(this->via_clock_).super_WrappedInt<HalfCycles>,&keyboard_ticks);
    MOS::MOS6522::
    MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
    ::run_for(&this->via_,HVar5);
  }
  WrappedInt<HalfCycles>::operator+=
            (&(this->keyboard_clock_).super_WrappedInt<HalfCycles>,(HalfCycles *)&this_local);
  bVar2 = WrappedInt<HalfCycles>::operator>=
                    (&(this->keyboard_clock_).super_WrappedInt<HalfCycles>,
                     (HalfCycles *)&(anonymous_namespace)::KEYBOARD_CLOCK_RATE);
  if (bVar2) {
    mouse_ticks = WrappedInt<HalfCycles>::divide<HalfCycles>
                            (&(this->keyboard_clock_).super_WrappedInt<HalfCycles>,
                             (HalfCycles *)&(anonymous_namespace)::KEYBOARD_CLOCK_RATE);
    Macintosh::Keyboard::run_for(&this->keyboard_,mouse_ticks);
    bVar2 = Macintosh::Keyboard::get_data(&this->keyboard_);
    MOS::MOS6522::
    MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
    ::set_control_line_input(&this->via_,B,Two,bVar2);
    bVar2 = Macintosh::Keyboard::get_clock(&this->keyboard_);
    MOS::MOS6522::
    MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
    ::set_control_line_input(&this->via_,B,One,bVar2);
  }
  bVar2 = Inputs::QuadratureMouse::has_steps(&this->mouse_);
  if (bVar2) {
    WrappedInt<HalfCycles>::operator+=
              (&(this->time_since_mouse_update_).super_WrappedInt<HalfCycles>,
               (HalfCycles *)&this_local);
    HalfCycles::HalfCycles(&local_a0,0x9c4);
    local_98.length_ =
         (IntType)WrappedInt<HalfCycles>::divide<HalfCycles>
                            (&(this->time_since_mouse_update_).super_WrappedInt<HalfCycles>,
                             &local_a0);
    HalfCycles::HalfCycles((HalfCycles *)&ticks,0);
    bVar2 = WrappedInt<HalfCycles>::operator>(&local_98,(HalfCycles *)&ticks);
    if (bVar2) {
      Inputs::QuadratureMouse::prepare_step(&this->mouse_);
      uVar3 = Inputs::QuadratureMouse::get_channel(&this->mouse_,1);
      Zilog::SCC::z8530::set_dcd(&this->scc_,0,(uVar3 & 1) != 0);
      uVar3 = Inputs::QuadratureMouse::get_channel(&this->mouse_,0);
      Zilog::SCC::z8530::set_dcd(&this->scc_,1,(uVar3 & 1) != 0);
    }
  }
  WrappedInt<HalfCycles>::operator+=
            (&(this->real_time_clock_).super_WrappedInt<HalfCycles>,(HalfCycles *)&this_local);
  Cycles::Cycles(&local_c0,0x778800);
  local_b8.length_ = (IntType)HalfCycles::divide_cycles(&this->real_time_clock_,&local_c0);
  local_b0 = WrappedInt<Cycles>::as_integral(&local_b8);
  while (local_b0 != 0) {
    local_b0 = local_b0 + -1;
    Clock::ClockStorage::update(&(this->clock_).super_ClockStorage);
    MOS::MOS6522::
    MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
    ::set_control_line_input(&this->via_,A,Two,true);
    MOS::MOS6522::
    MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
    ::set_control_line_input(&this->via_,A,Two,false);
  }
  return;
}

Assistant:

forceinline void advance_time(HalfCycles duration) {
			time_since_video_update_ += duration;
			iwm_ += duration;
			ram_subcycle_ = (ram_subcycle_ + duration.as_integral()) & 15;

			// The VIA runs at one-tenth of the 68000's clock speed, in sync with the E clock.
			// See: Guide to the Macintosh Hardware Family p149 (PDF p188). Some extra division
			// may occur here in order to provide VSYNC at a proper moment.

			// Possibly route vsync.
			if(time_since_video_update_ < time_until_video_event_) {
				via_clock_ += duration;
				via_.run_for(via_clock_.divide(HalfCycles(10)));
			} else {
				auto via_time_base = time_since_video_update_ - duration;
				auto via_cycles_outstanding = duration;
				while(time_until_video_event_ < time_since_video_update_) {
					const auto via_cycles = time_until_video_event_ - via_time_base;
					via_time_base = HalfCycles(0);
					via_cycles_outstanding -= via_cycles;

					via_clock_ += via_cycles;
					via_.run_for(via_clock_.divide(HalfCycles(10)));

					video_.run_for(time_until_video_event_);
					time_since_video_update_ -= time_until_video_event_;
					time_until_video_event_ = video_.next_sequence_point();

					via_.set_control_line_input(MOS::MOS6522::Port::A, MOS::MOS6522::Line::One, !video_.vsync());
				}

				via_clock_ += via_cycles_outstanding;
				via_.run_for(via_clock_.divide(HalfCycles(10)));
			}

			// The keyboard also has a clock, albeit a very slow one — 100,000 cycles/second.
			// Its clock and data lines are connected to the VIA.
			keyboard_clock_ += duration;
			if(keyboard_clock_ >= KEYBOARD_CLOCK_RATE) {
				const auto keyboard_ticks = keyboard_clock_.divide(KEYBOARD_CLOCK_RATE);
				keyboard_.run_for(keyboard_ticks);
				via_.set_control_line_input(MOS::MOS6522::Port::B, MOS::MOS6522::Line::Two, keyboard_.get_data());
				via_.set_control_line_input(MOS::MOS6522::Port::B, MOS::MOS6522::Line::One, keyboard_.get_clock());
			}

			// Feed mouse inputs within at most 1250 cycles of each other.
			if(mouse_.has_steps()) {
				time_since_mouse_update_ += duration;
				const auto mouse_ticks = time_since_mouse_update_.divide(HalfCycles(2500));
				if(mouse_ticks > HalfCycles(0)) {
					mouse_.prepare_step();
					scc_.set_dcd(0, mouse_.get_channel(1) & 1);
					scc_.set_dcd(1, mouse_.get_channel(0) & 1);
				}
			}

			// TODO: SCC should be clocked at a divide-by-two, if and when it actually has
			// anything connected.

			// Consider updating the real-time clock.
			real_time_clock_ += duration;
			auto ticks = real_time_clock_.divide_cycles(Cycles(CLOCK_RATE)).as_integral();
			while(ticks--) {
				clock_.update();
				// TODO: leave a delay between toggling the input rather than using this coupled hack.
				via_.set_control_line_input(MOS::MOS6522::Port::A, MOS::MOS6522::Line::Two, true);
				via_.set_control_line_input(MOS::MOS6522::Port::A, MOS::MOS6522::Line::Two, false);
			}

			// Update the SCSI if currently active.
			if constexpr (model == Analyser::Static::Macintosh::Target::Model::MacPlus) {
				if(scsi_bus_is_clocked_) scsi_bus_.run_for(duration);
			}
		}